

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O0

void WebPConvertARGBToUV_C(uint32_t *argb,uint8_t *u,uint8_t *v,int src_width,int do_store)

{
  int iVar1;
  int iVar2;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  int in_R8D;
  int tmp_v_1;
  int tmp_u_1;
  int b_1;
  int g_1;
  int r_1;
  uint32_t v0_1;
  int tmp_v;
  int tmp_u;
  int b;
  int g;
  int r;
  uint32_t v1;
  uint32_t v0;
  int i;
  int uv_width;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 local_28;
  
  for (local_28 = 0; local_28 < (int)in_ECX >> 1; local_28 = local_28 + 1) {
    iVar1 = VP8RGBToU(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                      in_stack_ffffffffffffff98);
    iVar2 = VP8RGBToV(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                      in_stack_ffffffffffffff98);
    if (in_R8D == 0) {
      *(char *)(in_RSI + local_28) =
           (char)((int)((uint)*(byte *)(in_RSI + local_28) + iVar1 + 1) >> 1);
      *(char *)(in_RDX + local_28) =
           (char)((int)((uint)*(byte *)(in_RDX + local_28) + iVar2 + 1) >> 1);
    }
    else {
      *(char *)(in_RSI + local_28) = (char)iVar1;
      *(char *)(in_RDX + local_28) = (char)iVar2;
    }
  }
  if ((in_ECX & 1) != 0) {
    iVar1 = VP8RGBToU(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                      in_stack_ffffffffffffff98);
    iVar2 = VP8RGBToV(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                      in_stack_ffffffffffffff98);
    if (in_R8D == 0) {
      *(char *)(in_RSI + local_28) =
           (char)((int)((uint)*(byte *)(in_RSI + local_28) + iVar1 + 1) >> 1);
      *(char *)(in_RDX + local_28) =
           (char)((int)((uint)*(byte *)(in_RDX + local_28) + iVar2 + 1) >> 1);
    }
    else {
      *(char *)(in_RSI + local_28) = (char)iVar1;
      *(char *)(in_RDX + local_28) = (char)iVar2;
    }
  }
  return;
}

Assistant:

void WebPConvertARGBToUV_C(const uint32_t* argb, uint8_t* u, uint8_t* v,
                           int src_width, int do_store) {
  // No rounding. Last pixel is dealt with separately.
  const int uv_width = src_width >> 1;
  int i;
  for (i = 0; i < uv_width; ++i) {
    const uint32_t v0 = argb[2 * i + 0];
    const uint32_t v1 = argb[2 * i + 1];
    // VP8RGBToU/V expects four accumulated pixels. Hence we need to
    // scale r/g/b value by a factor 2. We just shift v0/v1 one bit less.
    const int r = ((v0 >> 15) & 0x1fe) + ((v1 >> 15) & 0x1fe);
    const int g = ((v0 >>  7) & 0x1fe) + ((v1 >>  7) & 0x1fe);
    const int b = ((v0 <<  1) & 0x1fe) + ((v1 <<  1) & 0x1fe);
    const int tmp_u = VP8RGBToU(r, g, b, YUV_HALF << 2);
    const int tmp_v = VP8RGBToV(r, g, b, YUV_HALF << 2);
    if (do_store) {
      u[i] = tmp_u;
      v[i] = tmp_v;
    } else {
      // Approximated average-of-four. But it's an acceptable diff.
      u[i] = (u[i] + tmp_u + 1) >> 1;
      v[i] = (v[i] + tmp_v + 1) >> 1;
    }
  }
  if (src_width & 1) {       // last pixel
    const uint32_t v0 = argb[2 * i + 0];
    const int r = (v0 >> 14) & 0x3fc;
    const int g = (v0 >>  6) & 0x3fc;
    const int b = (v0 <<  2) & 0x3fc;
    const int tmp_u = VP8RGBToU(r, g, b, YUV_HALF << 2);
    const int tmp_v = VP8RGBToV(r, g, b, YUV_HALF << 2);
    if (do_store) {
      u[i] = tmp_u;
      v[i] = tmp_v;
    } else {
      u[i] = (u[i] + tmp_u + 1) >> 1;
      v[i] = (v[i] + tmp_v + 1) >> 1;
    }
  }
}